

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_gen.cpp
# Opt level: O3

void __thiscall crnlib::corpus_gen::sort_blocks(corpus_gen *this,image_u8 *img)

{
  uint uVar1;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0 aVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  double dVar4;
  uint min_new_capacity;
  uint *puVar6;
  ulong uVar7;
  uint x_1;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint i;
  uint uVar11;
  ulong uVar12;
  uchar *puVar13;
  long lVar14;
  color_quad_u8 *pcVar15;
  uint x;
  int iVar16;
  long lVar17;
  ulong uVar18;
  uint y;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  vector<unsigned_int> remaining_blocks;
  int local_134;
  ulong local_120;
  double local_118;
  vector<unsigned_int> block_indices1;
  vector<unsigned_int> block_indices0;
  vector<float> block_std_dev;
  image_u8 new_img;
  color_quad_u8 c [16];
  ulong uVar5;
  
  uVar1 = img->m_width;
  uVar8 = img->m_height;
  min_new_capacity = uVar1 >> 2;
  uVar5 = (ulong)min_new_capacity;
  uVar9 = (ulong)(uVar8 >> 2);
  uVar24 = (uVar8 >> 2) * min_new_capacity;
  console::printf("Sorting %u blocks...",(ulong)uVar24);
  block_std_dev.m_p = (float *)0x0;
  block_std_dev.m_size = 0;
  block_std_dev.m_capacity = 0;
  if (uVar24 != 0) {
    elemental_vector::increase_capacity
              ((elemental_vector *)&block_std_dev,uVar24,uVar24 == 1,4,(object_mover)0x0,false);
    memset(block_std_dev.m_p + (block_std_dev._8_8_ & 0xffffffff),0,
           (ulong)(uVar24 - block_std_dev.m_size) << 2);
    block_std_dev.m_size = uVar24;
  }
  if (3 < uVar8) {
    iVar26 = 0;
    local_120 = 0;
    do {
      if (3 < uVar1) {
        iVar23 = 0;
        uVar25 = 0;
        do {
          pcVar3 = img->m_pPixels;
          uVar11 = img->m_pitch;
          iVar10 = iVar26 * uVar11 + iVar23;
          puVar13 = &c[0].field_0.field_0.a;
          lVar14 = 0;
          do {
            lVar17 = 0;
            do {
              uVar19 = iVar10 + (int)lVar17;
              puVar13[lVar17 * 4 + -3] = pcVar3[uVar19].field_0.field_0.r;
              puVar13[lVar17 * 4 + -2] = pcVar3[uVar19].field_0.field_0.g;
              puVar13[lVar17 * 4 + -1] = pcVar3[uVar19].field_0.field_0.b;
              puVar13[lVar17 * 4] = pcVar3[uVar19].field_0.field_0.a;
              lVar17 = lVar17 + 1;
            } while (lVar17 != 4);
            lVar14 = lVar14 + 1;
            iVar10 = iVar10 + uVar11;
            puVar13 = puVar13 + 0x10;
          } while (lVar14 != 4);
          uVar11 = 0;
          local_118 = 0.0;
          do {
            dVar4 = image_utils::compute_std_dev(0x10,c,uVar11,1);
            local_118 = local_118 + dVar4;
            uVar11 = uVar11 + 1;
          } while (uVar11 != 3);
          block_std_dev.m_p[min_new_capacity * (int)local_120 + (int)uVar25] = (float)local_118;
          uVar25 = uVar25 + 1;
          iVar23 = iVar23 + 4;
        } while (uVar25 != uVar5);
      }
      local_120 = local_120 + 1;
      iVar26 = iVar26 + 4;
    } while (local_120 != uVar9);
  }
  block_indices0.m_p = (uint *)0x0;
  block_indices0.m_size = 0;
  block_indices0.m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&block_indices0,uVar24,uVar24 == 1,4,(object_mover)0x0,false);
  memset(block_indices0.m_p + (block_indices0._8_8_ & 0xffffffff),0,
         (ulong)(uVar24 - block_indices0.m_size) << 2);
  block_indices0.m_size = uVar24;
  block_indices1.m_p = (uint *)0x0;
  block_indices1.m_size = 0;
  block_indices1.m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&block_indices1,uVar24,uVar24 == 1,4,(object_mover)0x0,false);
  memset(block_indices1.m_p + (block_indices1._8_8_ & 0xffffffff),0,
         (ulong)(uVar24 - block_indices1.m_size) << 2);
  block_indices1.m_size = uVar24;
  puVar6 = indirect_radix_sort<unsigned_int,float>
                     (uVar24,block_indices0.m_p,block_indices1.m_p,block_std_dev.m_p,0,4,true);
  c[0].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0xff000000;
  image<crnlib::color_quad<unsigned_char,_int>_>::image
            (&new_img,img->m_width,img->m_height,0xffffffff,c,0xf);
  if (uVar24 != 0) {
    uVar25 = 0;
    do {
      image<crnlib::color_quad<unsigned_char,_int>_>::unclipped_blit
                (&new_img,puVar6[uVar25] % min_new_capacity << 2,
                 puVar6[uVar25] / min_new_capacity << 2,4,4,(int)((uVar25 & 0xffffffff) % uVar5) * 4
                 ,(int)((uVar25 & 0xffffffff) / uVar5) << 2,img);
      uVar25 = uVar25 + 1;
    } while (uVar24 != uVar25);
  }
  remaining_blocks.m_p = (uint *)0x0;
  remaining_blocks.m_size = 0;
  remaining_blocks.m_capacity = 0;
  if (3 < uVar1) {
    elemental_vector::increase_capacity
              ((elemental_vector *)&remaining_blocks,min_new_capacity,min_new_capacity == 1,4,
               (object_mover)0x0,false);
    memset(remaining_blocks.m_p + (remaining_blocks._8_8_ & 0xffffffff),0,
           (ulong)(min_new_capacity - remaining_blocks.m_size) << 2);
    remaining_blocks.m_size = min_new_capacity;
  }
  console::printf("Arranging %u blocks...");
  if (3 < uVar8) {
    local_134 = 0;
    uVar25 = 0;
    do {
      console::printf("%u of %u",uVar25,uVar9);
      if (remaining_blocks.m_size != min_new_capacity) {
        if (remaining_blocks.m_size <= min_new_capacity) {
          if (remaining_blocks.m_capacity < min_new_capacity) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&remaining_blocks,min_new_capacity,
                       remaining_blocks.m_size + 1 == min_new_capacity,4,(object_mover)0x0,false);
          }
          memset(remaining_blocks.m_p + remaining_blocks.m_size,0,
                 (ulong)(min_new_capacity - remaining_blocks.m_size) << 2);
        }
        remaining_blocks.m_size = min_new_capacity;
      }
      if (3 < uVar1) {
        uVar7 = 0;
        do {
          remaining_blocks.m_p[uVar7] = (uint)uVar7;
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
        c[0xc].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[0xd].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[0xe].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[0xf].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[8].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[9].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[10].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[0xb].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[4].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[5].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[6].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[7].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[0].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[1].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[2].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        c[3].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        if (3 < uVar1) {
          uVar18 = remaining_blocks._8_8_ & 0xffffffff;
          iVar26 = 0;
          uVar7 = 0;
          do {
            if ((int)uVar18 == 0) {
              uVar8 = 0;
            }
            else {
              uVar21 = 0;
              uVar22 = 0xffffffffffffffff;
              uVar8 = 0;
              do {
                iVar23 = local_134 * new_img.m_pitch + remaining_blocks.m_p[uVar21] * 4;
                puVar13 = &c[0].field_0.field_0.b;
                lVar14 = 0;
                uVar12 = 0;
                do {
                  lVar17 = 0;
                  do {
                    uVar24 = iVar23 + (int)lVar17;
                    iVar16 = (uint)new_img.m_pPixels[uVar24].field_0.field_0.r -
                             (uint)puVar13[lVar17 * 4 + -2];
                    iVar20 = (uint)new_img.m_pPixels[uVar24].field_0.field_0.g -
                             (uint)puVar13[lVar17 * 4 + -1];
                    iVar10 = (uint)new_img.m_pPixels[uVar24].field_0.field_0.b -
                             (uint)puVar13[lVar17 * 4];
                    uVar12 = uVar12 + (uint)(iVar10 * iVar10 + iVar20 * iVar20 + iVar16 * iVar16);
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 4);
                  lVar14 = lVar14 + 1;
                  iVar23 = iVar23 + new_img.m_pitch;
                  puVar13 = puVar13 + 0x10;
                } while (lVar14 != 4);
                if (uVar12 < uVar22) {
                  uVar22 = uVar12;
                  uVar8 = (uint)uVar21;
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar18);
            }
            uVar24 = remaining_blocks.m_p[uVar8];
            pcVar15 = c;
            lVar14 = 0;
            iVar23 = local_134;
            do {
              lVar17 = 0;
              do {
                uVar19 = new_img.m_pitch * iVar23 + uVar24 * 4 + (int)lVar17;
                aVar2 = new_img.m_pPixels[uVar19].field_0.field_0;
                pcVar15[lVar17].field_0 =
                     (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)aVar2;
                pcVar3 = img->m_pPixels;
                uVar27 = img->m_pitch * iVar23 + iVar26 + (int)lVar17;
                pcVar3[uVar27].field_0.field_0.r = aVar2.r;
                pcVar3[uVar27].field_0.field_0.g = new_img.m_pPixels[uVar19].field_0.field_0.g;
                pcVar3[uVar27].field_0.field_0.b = new_img.m_pPixels[uVar19].field_0.field_0.b;
                pcVar3[uVar27].field_0.field_0.a = new_img.m_pPixels[uVar19].field_0.field_0.a;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 4);
              lVar14 = lVar14 + 1;
              iVar23 = iVar23 + 1;
              pcVar15 = pcVar15 + 4;
            } while (lVar14 != 4);
            if (uVar8 + 1 < remaining_blocks.m_size) {
              remaining_blocks.m_p[uVar8] = remaining_blocks.m_p[remaining_blocks.m_size - 1];
            }
            if (remaining_blocks.m_size == 0) {
              uVar18 = 0;
            }
            else {
              uVar18 = (ulong)(remaining_blocks.m_size - 1);
              remaining_blocks.m_size = remaining_blocks.m_size - 1;
            }
            uVar7 = uVar7 + 1;
            iVar26 = iVar26 + 4;
          } while (uVar7 != uVar5);
        }
      }
      uVar25 = uVar25 + 1;
      local_134 = local_134 + 4;
    } while (uVar25 != uVar9);
  }
  if (remaining_blocks.m_p != (uint *)0x0) {
    crnlib_free(remaining_blocks.m_p);
  }
  if (new_img.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
    crnlib_free(new_img.m_pixel_buf.m_p);
  }
  if (block_indices1.m_p != (uint *)0x0) {
    crnlib_free(block_indices1.m_p);
  }
  if (block_indices0.m_p != (uint *)0x0) {
    crnlib_free(block_indices0.m_p);
  }
  if (block_std_dev.m_p != (float *)0x0) {
    crnlib_free(block_std_dev.m_p);
  }
  return;
}

Assistant:

void corpus_gen::sort_blocks(image_u8& img) {
  const uint num_blocks_x = img.get_width() / 4;
  const uint num_blocks_y = img.get_height() / 4;
  const uint total_blocks = num_blocks_x * num_blocks_y;

  console::printf("Sorting %u blocks...", total_blocks);

  crnlib::vector<float> block_std_dev(total_blocks);

  for (uint by = 0; by < num_blocks_y; by++) {
    for (uint bx = 0; bx < num_blocks_x; bx++) {
      color_quad_u8 c[4 * 4];

      for (uint y = 0; y < 4; y++)
        for (uint x = 0; x < 4; x++)
          c[x + y * 4] = img(bx * 4 + x, by * 4 + y);

      double std_dev = 0.0f;
      for (uint i = 0; i < 3; i++)
        std_dev += image_utils::compute_std_dev(16, c, i, 1);

      block_std_dev[bx + by * num_blocks_x] = (float)std_dev;
    }
  }

  crnlib::vector<uint> block_indices0(total_blocks);
  crnlib::vector<uint> block_indices1(total_blocks);

  const uint* pIndices = indirect_radix_sort(total_blocks, &block_indices0[0], &block_indices1[0], &block_std_dev[0], 0, sizeof(float), true);

  image_u8 new_img(img.get_width(), img.get_height());

  uint dst_block_index = 0;

  //float prev_std_dev = -999;
  for (uint i = 0; i < total_blocks; i++) {
    uint src_block_index = pIndices[i];

    //float std_dev = block_std_dev[src_block_index];
    //crnlib_ASSERT(std_dev >= prev_std_dev);
    //prev_std_dev = std_dev;

    uint src_block_x = src_block_index % num_blocks_x;
    uint src_block_y = src_block_index / num_blocks_x;

    uint dst_block_x = dst_block_index % num_blocks_x;
    uint dst_block_y = dst_block_index / num_blocks_x;

    new_img.unclipped_blit(src_block_x * 4, src_block_y * 4, 4, 4, dst_block_x * 4, dst_block_y * 4, img);

    dst_block_index++;
  }

#if 0      
      //new_img.swap(img);
#else
  crnlib::vector<uint> remaining_blocks(num_blocks_x);

  console::printf("Arranging %u blocks...", total_blocks);

  for (uint by = 0; by < num_blocks_y; by++) {
    console::printf("%u of %u", by, num_blocks_y);

    remaining_blocks.resize(num_blocks_x);
    for (uint i = 0; i < num_blocks_x; i++)
      remaining_blocks[i] = i;

    color_quad_u8 match_block[16];
    utils::zero_object(match_block);
    for (uint bx = 0; bx < num_blocks_x; bx++) {
      uint best_index = 0;

      uint64 best_error = cUINT64_MAX;

      for (uint i = 0; i < remaining_blocks.size(); i++) {
        uint src_block_index = remaining_blocks[i];

        uint64 error = 0;
        for (uint y = 0; y < 4; y++) {
          for (uint x = 0; x < 4; x++) {
            const color_quad_u8& c = new_img(src_block_index * 4 + x, by * 4 + y);
            error += color::elucidian_distance(c, match_block[x + y * 4], false);
          }
        }

        if (error < best_error) {
          best_error = error;
          best_index = i;
        }
      }

      uint src_block_index = remaining_blocks[best_index];

      for (uint y = 0; y < 4; y++) {
        for (uint x = 0; x < 4; x++) {
          const color_quad_u8& c = new_img(src_block_index * 4 + x, by * 4 + y);
          match_block[x + y * 4] = c;

          img(bx * 4 + x, by * 4 + y) = c;
        }
      }

      remaining_blocks.erase_unordered(best_index);
    }
  }
#endif
}